

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

void __thiscall MCTS::Node<ConnectFourState>::~Node(Node<ConnectFourState> *this)

{
  bool bVar1;
  iterator this_00;
  reference ppNVar2;
  __normal_iterator<MCTS::Node<ConnectFourState>_**,_std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>_>
  *in_RDI;
  Node<ConnectFourState> *child;
  iterator __end0;
  iterator __begin0;
  vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_> *__range2;
  Node<ConnectFourState> *in_stack_ffffffffffffffc8;
  __normal_iterator<MCTS::Node<ConnectFourState>_**,_std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>_>
  local_18;
  Node<ConnectFourState> *this_01;
  
  this_01 = (Node<ConnectFourState> *)(in_RDI + 8);
  local_18._M_current =
       (Node<ConnectFourState> **)
       std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
       ::begin((vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
                *)in_stack_ffffffffffffffc8);
  this_00 = std::
            vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
            ::end((vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
                   *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<MCTS::Node<ConnectFourState>_**,_std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<MCTS::Node<ConnectFourState>_**,_std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc8 = *ppNVar2;
    if (in_stack_ffffffffffffffc8 != (Node<ConnectFourState> *)0x0) {
      ~Node(this_01);
      operator_delete(in_stack_ffffffffffffffc8);
    }
    __gnu_cxx::
    __normal_iterator<MCTS::Node<ConnectFourState>_**,_std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>::
  ~vector((vector<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_> *
          )this_00._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)this_00._M_current);
  return;
}

Assistant:

Node<State>::~Node()
{
	for (auto child: children) {
		delete child;
	}
}